

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_ssg.cpp
# Opt level: O1

void __thiscall ymfm::ssg_engine::ssg_engine(ssg_engine *this,ymfm_interface *intf)

{
  this->m_intf = intf;
  this->m_tone_count[0] = 0;
  this->m_tone_count[1] = 0;
  *(undefined8 *)(this->m_tone_count + 2) = 0;
  this->m_tone_state[1] = 0;
  this->m_tone_state[2] = 0;
  this->m_envelope_count = 0;
  this->m_envelope_state = 0;
  this->m_noise_count = 0;
  this->m_noise_state = 1;
  this->m_override = (ssg_override *)0x0;
  return;
}

Assistant:

ssg_engine::ssg_engine(ymfm_interface &intf) :
	m_intf(intf),
	m_tone_count{ 0,0,0 },
	m_tone_state{ 0,0,0 },
	m_envelope_count(0),
	m_envelope_state(0),
	m_noise_count(0),
	m_noise_state(1),
	m_override(nullptr)
{
}